

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

Reference<std::allocator<absl::cord_internal::CordRep_*>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>::
EmplaceBackSlow<absl::cord_internal::CordRep*const&>
          (Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
           *this,CordRep **args)

{
  CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>
  CVar1;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> i;
  Pointer<std::allocator<absl::cord_internal::CordRep_*>_> ppCVar2;
  ulong uVar3;
  ulong uVar4;
  SizeType<std::allocator<absl::cord_internal::CordRep_*>_> SVar5;
  Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>> *pSVar6;
  bool bVar7;
  AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_> allocation_tx;
  
  uVar4 = *(ulong *)this >> 1;
  bVar7 = (*(ulong *)this & 1) != 0;
  pSVar6 = this + 8;
  if (bVar7) {
    pSVar6 = *(Storage<absl::cord_internal::CordRep*,2ul,std::allocator<absl::cord_internal::CordRep*>>
               **)(this + 8);
  }
  allocation_tx.allocator_data_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::cord_internal::CordRep_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::cord_internal::CordRep_**,_1UL,_false>)0x0;
  allocation_tx.capacity_ = 0;
  SVar5 = 4;
  if (bVar7) {
    SVar5 = *(long *)(this + 0x10) * 2;
  }
  ppCVar2 = AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::Allocate
                      (&allocation_tx,SVar5);
  ppCVar2[uVar4] = *args;
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(undefined8 *)
     ((long)allocation_tx.allocator_data_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<absl::cord_internal::CordRep_**,_1UL,_false>.value + uVar3 * 8) =
         *(undefined8 *)(pSVar6 + uVar3 * 8);
  }
  Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>::
  DeallocateIfAllocated
            ((Storage<absl::cord_internal::CordRep_*,_2UL,_std::allocator<absl::cord_internal::CordRep_*>_>
              *)this);
  SVar5 = allocation_tx.capacity_;
  CVar1 = allocation_tx.allocator_data_;
  allocation_tx.allocator_data_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<absl::cord_internal::CordRep_**,_1UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )(Storage<absl::cord_internal::CordRep_**,_1UL,_false>)0x0;
  allocation_tx.capacity_ = 0;
  *(CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
    *)(this + 8) =
       CVar1.
       super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::allocator<absl::cord_internal::CordRep_*>,_absl::cord_internal::CordRep_**>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<absl::cord_internal::CordRep_**,_1UL,_false>.value;
  *(SizeType<std::allocator<absl::cord_internal::CordRep_*>_> *)(this + 0x10) = SVar5;
  *(ulong *)this = (*(ulong *)this | 1) + 2;
  AllocationTransaction<std::allocator<absl::cord_internal::CordRep_*>_>::~AllocationTransaction
            (&allocation_tx);
  return ppCVar2 + uVar4;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }